

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

bool run_olc_editor(DESCRIPTOR_DATA *d)

{
  long in_RDI;
  char *in_stack_00002408;
  CHAR_DATA *in_stack_00002410;
  char *in_stack_00002428;
  CHAR_DATA *in_stack_00002430;
  char *in_stack_00002438;
  CHAR_DATA *in_stack_00002440;
  
  switch(*(undefined4 *)(in_RDI + 0x6c70)) {
  case 1:
    aedit(in_stack_00002430,in_stack_00002428);
    break;
  case 2:
    redit(in_stack_00002440,in_stack_00002438);
    break;
  case 3:
    oedit(in_stack_00002410,in_stack_00002408);
    break;
  case 4:
    medit(in_stack_00002410,in_stack_00002408);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool run_olc_editor(DESCRIPTOR_DATA *d)
{
	switch (d->editor)
	{
		case ED_AREA:
			aedit(d->character, d->incomm);
			break;
		case ED_ROOM:
			redit(d->character, d->incomm);
			break;
		case ED_OBJECT:
			oedit(d->character, d->incomm);
			break;
		case ED_MOBILE:
			medit(d->character, d->incomm);
			break;
		default:
			return false;
	}

	return true;
}